

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O2

void Cgt_ManCollectFanoutPos_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Ptr_t *vFanout)

{
  int iVar1;
  ulong uVar2;
  Aig_Obj_t *pObj_00;
  uint uVar3;
  uint uVar4;
  
  if (pObj->TravId != pAig->nTravIds) {
    pObj->TravId = pAig->nTravIds;
    uVar2 = *(ulong *)&pObj->field_0x18;
    if (((uint)uVar2 & 7) == 3) {
      Vec_PtrPush(vFanout,pObj);
      return;
    }
    if (pAig->pFanData == (int *)0x0) {
      __assert_fail("pAig->pFanData",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cgt/cgtDecide.c"
                    ,0x40,"void Cgt_ManCollectFanoutPos_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)")
      ;
    }
    uVar3 = 0xffffffff;
    for (uVar4 = 0; uVar4 < ((uint)(uVar2 >> 6) & 0x3ffffff); uVar4 = uVar4 + 1) {
      if (uVar4 == 0) {
        if (pAig->nFansAlloc <= pObj->Id) {
          __assert_fail("ObjId < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
        }
        iVar1 = pObj->Id * 5;
      }
      else {
        if (pAig->nFansAlloc <= (int)uVar3 / 2) {
          __assert_fail("iFan/2 < p->nFansAlloc",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
        }
        iVar1 = ((int)uVar3 >> 1) * 5 + (uVar3 & 1) + 3;
      }
      uVar3 = pAig->pFanData[iVar1];
      if (pAig->vObjs == (Vec_Ptr_t *)0x0) {
        pObj_00 = (Aig_Obj_t *)0x0;
      }
      else {
        pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,(int)uVar3 >> 1);
      }
      Cgt_ManCollectFanoutPos_rec(pAig,pObj_00,vFanout);
      uVar2 = *(ulong *)&pObj->field_0x18;
    }
  }
  return;
}

Assistant:

void Cgt_ManCollectFanoutPos_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Ptr_t * vFanout )
{
    Aig_Obj_t * pFanout;
    int f, iFanout = -1;
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    if ( Aig_ObjIsCo(pObj) )
    {
        Vec_PtrPush( vFanout, pObj );
        return;
    }
    Aig_ObjForEachFanout( pAig, pObj, pFanout, iFanout, f )
        Cgt_ManCollectFanoutPos_rec( pAig, pFanout, vFanout );
}